

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

int __thiscall pbrt::SubstrateMaterial::writeTo(SubstrateMaterial *this,BinaryWriter *binary)

{
  BinaryWriter *in_RSI;
  BinaryWriter *in_stack_fffffffffffffee8;
  BinaryWriter *in_stack_fffffffffffffef0;
  SP *in_stack_ffffffffffffff20;
  BinaryWriter *entity;
  BinaryWriter *in_stack_ffffffffffffff28;
  BinaryWriter *this_00;
  int32_t local_4c;
  int32_t local_38;
  int32_t local_14;
  BinaryWriter *local_10;
  
  local_10 = in_RSI;
  Material::writeTo((Material *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  BinaryWriter::write<pbrt::math::vec3f>
            (in_stack_fffffffffffffef0,(vec3f *)in_stack_fffffffffffffee8);
  std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Texture,void>
            ((shared_ptr<pbrt::Entity> *)in_stack_fffffffffffffef0,
             (shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffee8);
  local_14 = BinaryWriter::serialize(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  BinaryWriter::write<int>(in_stack_fffffffffffffef0,(int *)in_stack_fffffffffffffee8);
  std::shared_ptr<pbrt::Entity>::~shared_ptr((shared_ptr<pbrt::Entity> *)0x123d66);
  BinaryWriter::write<pbrt::math::vec3f>
            (in_stack_fffffffffffffef0,(vec3f *)in_stack_fffffffffffffee8);
  std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Texture,void>
            ((shared_ptr<pbrt::Entity> *)in_stack_fffffffffffffef0,
             (shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffee8);
  local_38 = BinaryWriter::serialize(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  BinaryWriter::write<int>(in_stack_fffffffffffffef0,(int *)in_stack_fffffffffffffee8);
  std::shared_ptr<pbrt::Entity>::~shared_ptr((shared_ptr<pbrt::Entity> *)0x123deb);
  this_00 = (BinaryWriter *)&stack0xffffffffffffffa0;
  entity = local_10;
  std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Texture,void>
            ((shared_ptr<pbrt::Entity> *)in_stack_fffffffffffffef0,
             (shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffee8);
  local_4c = BinaryWriter::serialize(this_00,(SP *)entity);
  BinaryWriter::write<int>(in_stack_fffffffffffffef0,(int *)in_stack_fffffffffffffee8);
  std::shared_ptr<pbrt::Entity>::~shared_ptr((shared_ptr<pbrt::Entity> *)0x123e57);
  BinaryWriter::write<float>(in_stack_fffffffffffffef0,(float *)in_stack_fffffffffffffee8);
  std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Texture,void>
            ((shared_ptr<pbrt::Entity> *)in_stack_fffffffffffffef0,
             (shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffee8);
  BinaryWriter::serialize(this_00,(SP *)entity);
  BinaryWriter::write<int>(in_stack_fffffffffffffef0,(int *)in_stack_fffffffffffffee8);
  std::shared_ptr<pbrt::Entity>::~shared_ptr((shared_ptr<pbrt::Entity> *)0x123ed6);
  BinaryWriter::write<float>(in_stack_fffffffffffffef0,(float *)in_stack_fffffffffffffee8);
  std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Texture,void>
            ((shared_ptr<pbrt::Entity> *)local_10,
             (shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffee8);
  BinaryWriter::serialize(this_00,(SP *)entity);
  BinaryWriter::write<int>(local_10,(int *)in_stack_fffffffffffffee8);
  std::shared_ptr<pbrt::Entity>::~shared_ptr((shared_ptr<pbrt::Entity> *)0x123f55);
  BinaryWriter::write<bool>(local_10,(bool *)in_stack_fffffffffffffee8);
  return 0x11;
}

Assistant:

int SubstrateMaterial::writeTo(BinaryWriter &binary) 
  {
    Material::writeTo(binary);
    binary.write(kd);
    binary.write(binary.serialize(map_kd));
    binary.write(ks);
    binary.write(binary.serialize(map_ks));
    binary.write(binary.serialize(map_bump));
    binary.write(uRoughness);
    binary.write(binary.serialize(map_uRoughness));
    binary.write(vRoughness);
    binary.write(binary.serialize(map_vRoughness));
    binary.write(remapRoughness);
    return TYPE_SUBSTRATE_MATERIAL;
  }